

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O1

bool Diligent::VerifyTraceRaysIndirectAttribs
               (IRenderDevice *pDevice,TraceRaysIndirectAttribs *Attribs,Uint32 SBTSize)

{
  IBuffer *pIVar1;
  int iVar2;
  char (*Args_1) [39];
  char (*in_RCX) [77];
  char (*in_R9) [53];
  string msg;
  string local_40;
  undefined4 extraout_var;
  
  pIVar1 = Attribs->pAttribsBuffer;
  if (Attribs->pSBT == (IShaderBindingTable *)0x0) {
    FormatString<char[42],char[22]>
              (&local_40,(Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])0x6c614c,(char (*) [22])in_RCX);
    in_RCX = (char (*) [77])0x453;
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x453);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = (*(Attribs->pSBT->super_IDeviceObject).super_IObject._vptr_IObject[8])(Attribs->pSBT,5);
  if ((char)iVar2 == '\0') {
    FormatString<char[42],char[77]>
              (&local_40,(Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])
               "not all shaders in SBT are bound or instance to shader mapping is incorrect.",in_RCX
              );
    in_RCX = (char (*) [77])0x457;
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x457);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (pIVar1 == (IBuffer *)0x0) {
    FormatString<char[42],char[53]>
              (&local_40,(Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])"indirect dispatch arguments buffer must not be null.",
               (char (*) [53])in_RCX);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x45a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar1);
  Args_1 = (char (*) [39])CONCAT44(extraout_var,iVar2);
  if (((*Args_1)[0x11] & 1U) == 0) {
    FormatString<char[42],char[39],char_const*,char[53]>
              (&local_40,(Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])"indirect trace rays arguments buffer \'",Args_1,
               (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",in_R9);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x45e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (((*Args_1)[0x11] & 4U) == 0) {
    FormatString<char[42],char[39],char_const*,char[46]>
              (&local_40,(Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])"indirect trace rays arguments buffer \'",Args_1,
               (char **)"\' was not created with BIND_RAY_TRACING flag.",(char (*) [46])in_R9);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(ulong *)(*Args_1 + 8) < (ulong)SBTSize + Attribs->ArgsByteOffset) {
    FormatString<char[42],char[39],char_const*,char[15]>
              (&local_40,(Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])"indirect trace rays arguments buffer \'",Args_1,
               (char **)"\' is too small",(char (*) [15])in_R9);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x462);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return true;
}

Assistant:

bool VerifyTraceRaysIndirectAttribs(const IRenderDevice* pDevice, const TraceRaysIndirectAttribs& Attribs, Uint32 SBTSize)
{
    const IBuffer* pAttribsBuffer = Attribs.pAttribsBuffer;

#define CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Trace rays indirect attribs are invalid: ", __VA_ARGS__)
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(Attribs.pSBT != nullptr, "pSBT must not be null");

#ifdef DILIGENT_DEVELOPMENT
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(Attribs.pSBT->Verify(VERIFY_SBT_FLAG_SHADER_ONLY | VERIFY_SBT_FLAG_TLAS),
                                      "not all shaders in SBT are bound or instance to shader mapping is incorrect.");
#endif // DILIGENT_DEVELOPMENT

    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(pAttribsBuffer != nullptr, "indirect dispatch arguments buffer must not be null.");

    const BufferDesc& Desc = pAttribsBuffer->GetDesc();
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS((Desc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0,
                                      "indirect trace rays arguments buffer '", Desc.Name, "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS((Desc.BindFlags & BIND_RAY_TRACING) != 0,
                                      "indirect trace rays arguments buffer '", Desc.Name, "' was not created with BIND_RAY_TRACING flag.");
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(Attribs.ArgsByteOffset + SBTSize <= Desc.Size,
                                      "indirect trace rays arguments buffer '", Desc.Name, "' is too small");

#undef CHECK_TRACE_RAYS_INDIRECT_ATTRIBS

    return true;
}